

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

void __thiscall sf::Texture::invalidateMipmap(Texture *this)

{
  TransientContextLock lock;
  TextureSaver save;
  TransientContextLock local_d;
  TextureSaver local_c;
  
  if (this->m_hasMipmap == true) {
    GlResource::TransientContextLock::TransientContextLock(&local_d);
    priv::TextureSaver::TextureSaver(&local_c);
    (*sf_glad_glBindTexture)(0xde1,this->m_texture);
    (*sf_glad_glTexParameteri)(0xde1,0x2801,this->m_isSmooth | 0x2600);
    this->m_hasMipmap = false;
    priv::TextureSaver::~TextureSaver(&local_c);
    GlResource::TransientContextLock::~TransientContextLock(&local_d);
  }
  return;
}

Assistant:

void Texture::invalidateMipmap()
{
    if (!m_hasMipmap)
        return;

    TransientContextLock lock;

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));

    m_hasMipmap = false;
}